

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

size_t gl3cts::TextureSwizzle::get_index_of_format(GLenum internal_format)

{
  size_t i;
  size_t sVar1;
  TestError *this;
  GLenum *pGVar2;
  
  if (internal_format == 0) {
    sVar1 = 0;
  }
  else {
    pGVar2 = &DAT_021930d4;
    sVar1 = 0;
    while (*pGVar2 != internal_format) {
      sVar1 = sVar1 + 1;
      pGVar2 = pGVar2 + 0x1e;
      if (sVar1 == 0x47) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unknown internal format",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                   ,0x721);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return sVar1;
}

Assistant:

size_t get_index_of_format(glw::GLenum internal_format)
{
	if (GL_ZERO == internal_format)
	{
		return 0;
	}

	for (size_t i = 0; i < n_texture_formats; ++i)
	{
		if (texture_formats[i].m_internal_format == internal_format)
		{
			return i;
		}
	}

	TCU_FAIL("Unknown internal format");
	return -1;
}